

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O2

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this,FactorGraph *fg,Properties *opts,size_t k)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar4;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Var *n;
  undefined4 extraout_var_08;
  VarSet *ns;
  Exception *this_02;
  ulong uVar5;
  VarSet local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ind;
  Index indi;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,fg,opts);
  this_00 = &this->_indices;
  this_01 = &this->_messages;
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f840;
  *(undefined8 *)&this->Props = 0;
  (this->Props).tol = 0.0;
  (this->Props).maxiter = 0;
  (this->Props).verbose = 0;
  (this->Props).damping = 0.0;
  this->_maxdiff = 0.0;
  this->_iterations = 0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_indices).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_messages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_newmessages).
  super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_g = fg;
  iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[5])(fg);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->bestConfiguration,CONCAT44(extraout_var,iVar3),(allocator_type *)&indi);
  this->_k = k;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_valConfs;
  (this->_valConfs).
  super__List_base<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this->_k_th_Val = -1.79769313486232e+308;
  this->writeAnyTimeResults = false;
  this->results_f = (ofstream *)0x0;
  this->timings_f = (ofstream *)0x0;
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])(this);
  if ((char)iVar3 != '\0') {
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::clear(this_01);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::reserve
              (this_01,*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x48) -
                       *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x40) >> 4);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::clear(this_00);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::reserve(this_00,*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x48) -
                      *(long *)(CONCAT44(extraout_var_01,iVar3) + 0x40) >> 4);
    uVar5 = 0;
    while( true ) {
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_02,iVar3) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_02,iVar3) + 0x40) >> 4) <= uVar5) break;
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar1 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_03,iVar3) + 0x40) + uVar5 * 0x10);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar2 = *(undefined8 *)(*(long *)(CONCAT44(extraout_var_04,iVar3) + 0x40) + 8 + uVar5 * 0x10);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x30))
                        ((long *)CONCAT44(extraout_var_05,iVar3),uVar1);
      TProb<double>::TProb((TProb<double> *)&indi,*(size_t *)(lVar4 + 8));
      std::vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>>::
      emplace_back<libDAI::TProb<double>>
                ((vector<libDAI::TProb<double>,std::allocator<libDAI::TProb<double>>> *)this_01,
                 (TProb<double> *)&indi);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&indi);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x50))
                        ((long *)CONCAT44(extraout_var_06,iVar3),uVar2);
      indi._index = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &ind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 *(long *)(lVar4 + 0x28) - *(long *)(lVar4 + 0x20) >> 3,
                 (value_type_conflict2 *)&indi,(allocator_type *)&local_b8);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x30))
                           ((long *)CONCAT44(extraout_var_07,iVar3),uVar1);
      VarSet::VarSet(&local_b8,n);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      ns = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x50))
                     ((long *)CONCAT44(extraout_var_08,iVar3),uVar2);
      Index::Index(&indi,&local_b8,ns);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_b8);
      lVar4 = 0;
      while (-1 < indi._index) {
        *(long *)((long)ind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar4) = indi._index;
        Index::operator++(&indi);
        lVar4 = lVar4 + 8;
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(this_00,(value_type *)
                          &ind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      Index::~Index(&indi);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&ind.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      uVar5 = uVar5 + 1;
    }
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator=
              (&this->_newmessages,this_01);
    return;
  }
  this_02 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&indi,"maxplus.cpp, line 93",(allocator<char> *)&local_b8);
  Exception::Exception(this_02,8,(string *)&indi);
  __cxa_throw(this_02,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MaxPlus::MaxPlus(const FactorGraph & fg, const Properties &opts, size_t k ) 
        : 
            DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), 
            _indices(), _messages(), _newmessages(),
            _g(&fg) , bestConfiguration( fg.nrVars() ), 
            _k(k),
            _k_th_Val(-DBL_MAX),
            writeAnyTimeResults(false), results_f(NULL), timings_f(NULL)
    {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // clear messages
        _messages.clear();
        _messages.reserve(grm().nrEdges());

        // clear indices
        _indices.clear();
        _indices.reserve(grm().nrEdges());

        // create messages and indices
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;

            _messages.push_back( Prob( grm().var(i).states() ) );

            vector<size_t> ind( grm().factor(I).stateSpace(), 0 );
            Index indi (grm().var(i), grm().factor(I).vars() );
            for( size_t j = 0; indi >= 0; ++indi,++j )
                ind[j] = indi; 
            _indices.push_back( ind );
        }

        // create new_messages
        _newmessages = _messages;
    }